

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

size_t mtbdd_nodecount_mark(MTBDD mtbdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    lVar4 = (mtbdd & 0xffffffffff) * 0x10;
    puVar1 = nodes->data;
    uVar2 = *(ulong *)(puVar1 + lVar4);
    if ((uVar2 & 0x2000000000000000) != 0) {
      lVar4 = 0;
LAB_0011ebb6:
      return lVar4 + lVar5;
    }
    *(ulong *)(puVar1 + lVar4) = uVar2 | 0x2000000000000000;
    if ((uVar2 >> 0x3e & 1) != 0) {
      lVar4 = 1;
      goto LAB_0011ebb6;
    }
    sVar3 = mtbdd_nodecount_mark(*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff);
    mtbdd = *(MTBDD *)(puVar1 + lVar4);
    lVar5 = lVar5 + 1 + sVar3;
  } while( true );
}

Assistant:

static size_t
mtbdd_nodecount_mark(MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (mtbddnode_getmark(n)) return 0;
    mtbddnode_setmark(n, 1);
    if (mtbddnode_isleaf(n)) return 1; // count leaf as 1
    return 1 + mtbdd_nodecount_mark(mtbddnode_getlow(n)) + mtbdd_nodecount_mark(mtbddnode_gethigh(n));
}